

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    FdOutputStream::~FdOutputStream((FdOutputStream *)((long)pointer + 0x18));
    OwnFd::~OwnFd((OwnFd *)((long)pointer + 0x10));
    ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)((long)pointer + 8));
    operator_delete(pointer,0x28);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }